

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_gesture.cpp
# Opt level: O0

int set_items_list_old_owner(Am_Value_List *items,Am_Object *widget)

{
  int iVar1;
  bool bVar2;
  Am_Value *in_value;
  Am_Wrapper *value;
  Am_Object local_50;
  Am_Object local_48;
  int local_40;
  int ret;
  Am_Object local_30;
  Am_Object item;
  Am_Value item_value;
  Am_Object *widget_local;
  Am_Value_List *items_local;
  
  Am_Value::Am_Value((Am_Value *)&item);
  Am_Object::Am_Object(&local_30);
  local_40 = 0;
  Am_Value_List::Start(items);
  while (bVar2 = Am_Value_List::Last(items), iVar1 = local_40, ((bVar2 ^ 0xffU) & 1) != 0) {
    in_value = Am_Value_List::Get(items);
    Am_Value::operator=((Am_Value *)&item,in_value);
    if ((short)item.data == -0x5fff) {
      Am_Object::Am_Object(&local_48,(Am_Value *)&item);
      Am_Object::operator=(&local_30,&local_48);
      Am_Object::~Am_Object(&local_48);
      Am_Object::Am_Object(&local_50,&Am_Command);
      bVar2 = Am_Object::Is_Instance_Of(&local_30,&local_50);
      Am_Object::~Am_Object(&local_50);
      if (bVar2) {
        value = Am_Object::operator_cast_to_Am_Wrapper_(widget);
        Am_Object::Set(&local_30,0x170,value,1);
        local_40 = 2;
      }
    }
    Am_Value_List::Next(items);
  }
  Am_Object::~Am_Object(&local_30);
  Am_Value::~Am_Value((Am_Value *)&item);
  return iVar1;
}

Assistant:

static int
set_items_list_old_owner(Am_Value_List items, Am_Object widget)
{
  Am_Value item_value;
  Am_Object item;
  int ret = 0; //not used, just for debugging
  for (items.Start(); !items.Last(); items.Next()) {
    item_value = items.Get();
    if (item_value.type == Am_OBJECT) {
      item = (Am_Object)item_value;
      if (item.Is_Instance_Of(Am_Command)) {
        item.Set(Am_SAVED_OLD_OWNER, widget, Am_OK_IF_NOT_THERE);
        ret = 2;
      }
    }
  }
  return ret;
}